

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWaveBank_Stop(FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags)

{
  short in_SI;
  long in_RDI;
  LinkedList *list;
  FACTWave *wave;
  long *local_28;
  uint32_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x11611b);
    for (local_28 = *(long **)(in_RDI + 8); local_28 != (long *)0x0; local_28 = (long *)local_28[1])
    {
      if (*(short *)(*local_28 + 0x10) == in_SI) {
        FACTWave_Stop(wave,list._4_4_);
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x11617d);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWaveBank_Stop(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags
) {
	FACTWave *wave;
	LinkedList *list;
	if (pWaveBank == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	list = pWaveBank->waveList;
	while (list != NULL)
	{
		wave = (FACTWave*) list->entry;
		if (wave->index == nWaveIndex)
		{
			FACTWave_Stop(wave, dwFlags);
		}
		list = list->next;
	}
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}